

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unisetspan.cpp
# Opt level: O2

int32_t __thiscall
icu_63::UnicodeSetStringSpan::spanNot(UnicodeSetStringSpan *this,UChar *s,int32_t length)

{
  short sVar1;
  uint uVar2;
  UBool UVar3;
  int32_t iVar4;
  int32_t iVar5;
  UnicodeString *this_00;
  char16_t *t;
  ulong uVar6;
  int length_00;
  int iVar7;
  
  uVar2 = this->strings->count;
  iVar7 = 0;
  if ((int)uVar2 < 1) {
    uVar2 = 0;
  }
  iVar5 = length;
  while( true ) {
    iVar4 = UnicodeSet::span(this->pSpanNotSet,s + iVar7,iVar5,USET_SPAN_NOT_CONTAINED);
    length_00 = iVar5 - iVar4;
    if (length_00 == 0) {
      return length;
    }
    iVar7 = iVar4 + iVar7;
    iVar5 = spanOne(&this->spanSet,s + iVar7,length_00);
    if (0 < iVar5) break;
    for (uVar6 = 0; uVar2 != uVar6; uVar6 = uVar6 + 1) {
      if (this->spanLengths[uVar6] != 0xff) {
        this_00 = (UnicodeString *)UVector::elementAt(this->strings,(int32_t)uVar6);
        t = UnicodeString::getBuffer(this_00);
        sVar1 = (this_00->fUnion).fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          iVar4 = (this_00->fUnion).fFields.fLength;
        }
        else {
          iVar4 = (int)sVar1 >> 5;
        }
        if ((iVar4 <= length_00) && (UVar3 = matches16CPB(s,iVar7,length,t,iVar4), UVar3 != '\0')) {
          return iVar7;
        }
      }
    }
    iVar7 = iVar7 - iVar5;
    iVar5 = length_00 + iVar5;
    if (iVar5 == 0) {
      return length;
    }
  }
  return iVar7;
}

Assistant:

int32_t UnicodeSetStringSpan::spanNot(const UChar *s, int32_t length) const {
    int32_t pos=0, rest=length;
    int32_t i, stringsLength=strings.size();
    do {
        // Span until we find a code point from the set,
        // or a code point that starts or ends some string.
        i=pSpanNotSet->span(s+pos, rest, USET_SPAN_NOT_CONTAINED);
        if(i==rest) {
            return length;  // Reached the end of the string.
        }
        pos+=i;
        rest-=i;

        // Check whether the current code point is in the original set,
        // without the string starts and ends.
        int32_t cpLength=spanOne(spanSet, s+pos, rest);
        if(cpLength>0) {
            return pos;  // There is a set element at pos.
        }

        // Try to match the strings at pos.
        for(i=0; i<stringsLength; ++i) {
            if(spanLengths[i]==ALL_CP_CONTAINED) {
                continue;  // Irrelevant string.
            }
            const UnicodeString &string=*(const UnicodeString *)strings.elementAt(i);
            const UChar *s16=string.getBuffer();
            int32_t length16=string.length();
            if(length16<=rest && matches16CPB(s, pos, length, s16, length16)) {
                return pos;  // There is a set element at pos.
            }
        }

        // The span(while not contained) ended on a string start/end which is
        // not in the original set. Skip this code point and continue.
        // cpLength<0
        pos-=cpLength;
        rest+=cpLength;
    } while(rest!=0);
    return length;  // Reached the end of the string.
}